

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldStatePdu.cpp
# Opt level: O1

bool __thiscall DIS::MinefieldStatePdu::operator==(MinefieldStatePdu *this,MinefieldStatePdu *rhs)

{
  uchar uVar1;
  uchar uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  pointer pVVar10;
  pointer pEVar11;
  long lVar12;
  ulong uVar13;
  
  bVar5 = MinefieldFamilyPdu::operator==
                    (&this->super_MinefieldFamilyPdu,&rhs->super_MinefieldFamilyPdu);
  bVar6 = MinefieldIdentifier::operator==(&this->_minefieldID,&rhs->_minefieldID);
  uVar3 = this->_minefieldSequence;
  uVar4 = rhs->_minefieldSequence;
  uVar1 = rhs->_forceID;
  uVar2 = this->_forceID;
  bVar7 = EntityType::operator==(&this->_minefieldType,&rhs->_minefieldType);
  bVar8 = Vector3Double::operator==(&this->_minefieldLocation,&rhs->_minefieldLocation);
  bVar9 = EulerAngles::operator==(&this->_minefieldOrientation,&rhs->_minefieldOrientation);
  bVar5 = (uVar2 == uVar1 && (uVar3 == uVar4 && (bVar6 && bVar5))) &&
          (this->_protocolMode == rhs->_protocolMode &&
          (this->_appearance == rhs->_appearance && (bVar9 && (bVar8 && bVar7))));
  pVVar10 = (this->_perimeterPoints).
            super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_perimeterPoints).
      super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar10) {
    lVar12 = 0;
    uVar13 = 0;
    do {
      bVar6 = Vector2Float::operator==
                        ((Vector2Float *)((long)&pVVar10->_vptr_Vector2Float + lVar12),
                         (Vector2Float *)
                         ((long)&((rhs->_perimeterPoints).
                                  super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_Vector2Float +
                         lVar12));
      if (!bVar6) {
        bVar5 = false;
      }
      uVar13 = uVar13 + 1;
      pVVar10 = (this->_perimeterPoints).
                super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x10;
    } while (uVar13 < (ulong)((long)(this->_perimeterPoints).
                                    super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 4)
            );
  }
  pEVar11 = (this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
      _M_impl.super__Vector_impl_data._M_finish != pEVar11) {
    lVar12 = 0;
    uVar13 = 0;
    do {
      bVar6 = EntityType::operator==
                        ((EntityType *)((long)&pEVar11->_vptr_EntityType + lVar12),
                         (EntityType *)
                         ((long)&((rhs->_mineType).
                                  super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_EntityType +
                         lVar12));
      if (!bVar6) {
        bVar5 = false;
      }
      uVar13 = uVar13 + 1;
      pEVar11 = (this->_mineType).
                super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x10;
    } while (uVar13 < (ulong)((long)(this->_mineType).
                                    super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar11 >> 4)
            );
  }
  return bVar5;
}

Assistant:

bool MinefieldStatePdu::operator ==(const MinefieldStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = MinefieldFamilyPdu::operator==(rhs);

     if( ! (_minefieldID == rhs._minefieldID) ) ivarsEqual = false;
     if( ! (_minefieldSequence == rhs._minefieldSequence) ) ivarsEqual = false;
     if( ! (_forceID == rhs._forceID) ) ivarsEqual = false;
     if( ! (_minefieldType == rhs._minefieldType) ) ivarsEqual = false;
     if( ! (_minefieldLocation == rhs._minefieldLocation) ) ivarsEqual = false;
     if( ! (_minefieldOrientation == rhs._minefieldOrientation) ) ivarsEqual = false;
     if( ! (_appearance == rhs._appearance) ) ivarsEqual = false;
     if( ! (_protocolMode == rhs._protocolMode) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _perimeterPoints.size(); idx++)
     {
        if( ! ( _perimeterPoints[idx] == rhs._perimeterPoints[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _mineType.size(); idx++)
     {
        if( ! ( _mineType[idx] == rhs._mineType[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }